

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

bool __thiscall
duckdb::StrpTimeFormat::TryParseDate
          (StrpTimeFormat *this,string_t input,date_t *result,string *error_message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *data;
  ParseResult parse_result;
  string local_c0;
  ParseResult local_a0;
  
  local_c0._M_string_length = input.value._8_8_;
  local_c0._M_dataplus._M_p = input.value._0_8_;
  local_a0.tz._M_dataplus._M_p = (pointer)&local_a0.tz.field_2;
  local_a0.tz._M_string_length = 0;
  local_a0.tz.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_a0.error_message.field_2;
  local_a0.error_message._M_string_length = 0;
  local_a0.error_message.field_2._M_local_buf[0] = '\0';
  local_a0.error_position.index = 0xffffffffffffffff;
  data = (char *)((long)&local_c0._M_dataplus._M_p + 4);
  if (0xc < ((ulong)local_c0._M_dataplus._M_p & 0xffffffff)) {
    data = (char *)local_c0._M_string_length;
  }
  local_a0.error_message._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = Parse(this,data,(ulong)local_c0._M_dataplus._M_p & 0xffffffff,&local_a0,false);
  if (bVar2) {
    bVar2 = Date::TryFromDate(local_a0.data[0],local_a0.data[1],local_a0.data[2],result);
  }
  else {
    ParseResult::FormatError
              (&local_c0,&local_a0,input,&(this->super_StrTimeFormat).format_specifier);
    ::std::__cxx11::string::operator=((string *)error_message,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.error_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.error_message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.tz._M_dataplus._M_p != &local_a0.tz.field_2) {
    operator_delete(local_a0.tz._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool StrpTimeFormat::TryParseDate(string_t input, date_t &result, string &error_message) const {
	ParseResult parse_result;
	if (!Parse(input, parse_result)) {
		error_message = parse_result.FormatError(input, format_specifier);
		return false;
	}
	return parse_result.TryToDate(result);
}